

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::ServiceDescriptor::CopyTo(ServiceDescriptor *this,ServiceDescriptorProto *proto)

{
  ushort *puVar1;
  FeatureSet *from;
  MethodDescriptor *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>_>
  *proto_00;
  ServiceOptions *this_01;
  ServiceOptions *pSVar2;
  FeatureSet *this_02;
  Arena *arena;
  int i;
  int index;
  string_view value;
  
  puVar1 = (ushort *)(this->all_names_).payload_;
  value._M_len = (ulong)*puVar1;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  value._M_str = (char *)((long)puVar1 + ~value._M_len);
  arena = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,arena);
  for (index = 0; index < this->method_count_; index = index + 1) {
    this_00 = method(this,index);
    proto_00 = internal::RepeatedPtrFieldBase::
               Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                         (&(proto->field_0)._impl_.method_.super_RepeatedPtrFieldBase);
    MethodDescriptor::CopyTo(this_00,proto_00);
  }
  pSVar2 = this->options_;
  if (pSVar2 != (ServiceOptions *)_ServiceOptions_default_instance_) {
    this_01 = ServiceDescriptorProto::mutable_options(proto);
    ServiceOptions::CopyFrom(this_01,pSVar2);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    pSVar2 = ServiceDescriptorProto::mutable_options(proto);
    this_02 = ServiceOptions::mutable_features(pSVar2);
    FeatureSet::CopyFrom(this_02,from);
    return;
  }
  return;
}

Assistant:

void ServiceDescriptor::CopyTo(ServiceDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < method_count(); i++) {
    method(i)->CopyTo(proto->add_method());
  }

  if (&options() != &ServiceOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}